

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O2

int64_t yactfr::internal::anon_unknown_0::readFlSIntLe30At5(uint8_t *buf)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = (*(ushort *)(buf + 3) & 0x7ff) << 0x13;
  uVar3 = (ulong)((uint)(*buf >> 5) + (uint)buf[1] * 8 | (uint)buf[2] << 0xb | uVar2);
  uVar1 = uVar3 - 0x40000000;
  if (uVar2 < 0x20000000) {
    uVar1 = uVar3;
  }
  return uVar1;
}

Assistant:

std::int64_t readFlSIntLe30At5(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 3;
    res |= (buf[0] >> 5);
    res &= UINT64_C(0x3fffffff);

    if (res >> 29) {
        res |= UINT64_C(0xffffffffc0000000);
    }

    return static_cast<std::int64_t>(res);
}